

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

int __thiscall re2::Prog::first_byte(Prog *this)

{
  long in_RDI;
  Prog **unaff_retaddr;
  anon_class_1_0_00000001 *in_stack_00000008;
  once_flag *in_stack_00000010;
  
  std::call_once<re2::Prog::first_byte()::__0,re2::Prog*>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return *(int *)(in_RDI + 0x18);
}

Assistant:

int Prog::first_byte() {
  std::call_once(first_byte_once_, [](Prog* prog) {
    prog->first_byte_ = prog->ComputeFirstByte();
  }, this);
  return first_byte_;
}